

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.c
# Opt level: O1

void * mi_heap_zalloc(mi_heap_t *heap,size_t size)

{
  long lVar1;
  undefined8 *__s;
  void *adst;
  void *pvVar2;
  
  if (size < 0x401) {
    lVar1 = *(long *)((long)heap->pages_free_direct + (size + 7 & 0xfffffffffffffff8));
    __s = *(undefined8 **)(lVar1 + 0x10);
    if (__s != (undefined8 *)0x0) {
      *(undefined8 *)(lVar1 + 0x10) = *__s;
      *(short *)(lVar1 + 0x20) = *(short *)(lVar1 + 0x20) + 1;
      if ((*(byte *)(lVar1 + 0xf) & 1) == 0) {
        pvVar2 = memset(__s,0,*(size_t *)(lVar1 + 0x28));
        return pvVar2;
      }
      *__s = 0;
      return __s;
    }
  }
  pvVar2 = _mi_malloc_generic(heap,size,true,0);
  return pvVar2;
}

Assistant:

void* mi_heap_zalloc(mi_heap_t* heap, size_t size) mi_attr_noexcept {
  return _mi_heap_malloc_zero(heap, size, true);
}